

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svectorbase.h
# Opt level: O2

void __thiscall
soplex::
SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::sort(SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       *this)

{
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar1;
  int iVar2;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar3;
  long lVar4;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar5;
  long lVar6;
  long lVar7;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  dummy;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_78;
  
  pNVar3 = this->m_elem;
  if (pNVar3 != (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x0) {
    local_78.val.m_backend.fpclass = cpp_dec_float_finite;
    local_78.val.m_backend.prec_elem = 10;
    local_78.val.m_backend.data._M_elems[0] = 0;
    local_78.val.m_backend.data._M_elems[1] = 0;
    local_78.val.m_backend.data._M_elems[2] = 0;
    local_78.val.m_backend.data._M_elems[3] = 0;
    local_78.val.m_backend.data._M_elems[4] = 0;
    local_78.val.m_backend.data._M_elems[5] = 0;
    local_78.val.m_backend.data._M_elems._24_5_ = 0;
    local_78.val.m_backend.data._M_elems[7]._1_3_ = 0;
    local_78.val.m_backend.data._M_elems._32_5_ = 0;
    local_78.val.m_backend._37_8_ = 0;
    local_78.idx = 0;
    iVar2 = this->memused;
    lVar6 = 0;
    pNVar5 = pNVar3;
    while (pNVar1 = pNVar5 + 1, pNVar1 < pNVar3 + iVar2) {
      if (pNVar5[1].idx < pNVar5->idx) {
        Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator=(&local_78,pNVar1);
        lVar4 = lVar6;
        do {
          lVar7 = lVar4;
          Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::operator=((Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)((long)pNVar3[1].val.m_backend.data._M_elems + lVar7),
                      (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)((long)(pNVar3->val).m_backend.data._M_elems + lVar7));
          pNVar5 = pNVar3;
          if (lVar7 == 0) goto LAB_00259e42;
          lVar4 = lVar7 + -0x3c;
        } while (local_78.idx < *(int *)((long)(pNVar3->val).m_backend.data._M_elems + lVar7 + -4));
        pNVar5 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)((long)(pNVar3->val).m_backend.data._M_elems + lVar7);
LAB_00259e42:
        Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator=(pNVar5,&local_78);
      }
      lVar6 = lVar6 + 0x3c;
      pNVar5 = pNVar1;
    }
  }
  return;
}

Assistant:

void sort()
   {
      if(m_elem != nullptr)
      {
         Nonzero<R> dummy;
         Nonzero<R>* w;
         Nonzero<R>* l;
         Nonzero<R>* s = &(m_elem[0]);
         Nonzero<R>* e = s + size();

         for(l = s, w = s + 1; w < e; l = w, ++w)
         {
            if(l->idx > w->idx)
            {
               dummy = *w;

               do
               {
                  l[1] = *l;

                  if(l-- == s)
                     break;
               }
               while(l->idx > dummy.idx);

               l[1] = dummy;
            }
         }
      }
   }